

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

void __thiscall MipsGenerator::TranslateJUMP(MipsGenerator *this,Pcode *item)

{
  bool bVar1;
  string *str;
  string num1;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_70,(string *)&item->m_num1);
  bVar1 = std::operator==(&local_70,"RA");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,"jr $ra",&local_71);
    str = &local_30;
  }
  else {
    std::operator+(&local_50,"j ",&local_70);
    str = &local_50;
  }
  Output2File(this,str);
  std::__cxx11::string::~string((string *)str);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void MipsGenerator::TranslateJUMP(Pcode& item) {
    string num1 = item.GetNum1();
    if (num1 == "RA") {
        Output2File("jr $ra");
    } else {
        Output2File("j " + num1);
    }
}